

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.cpp
# Opt level: O3

void duckdb::ListUpdateFunction
               (Vector *inputs,AggregateInputData *aggr_input_data,idx_t input_count,
               Vector *state_vector,idx_t count)

{
  FunctionData *pFVar1;
  LinkedList *linked_list;
  idx_t iVar2;
  UnifiedVectorFormat states_data;
  RecursiveUnifiedVectorFormat input_data;
  idx_t local_f8;
  UnifiedVectorFormat local_f0;
  RecursiveUnifiedVectorFormat local_a8;
  
  UnifiedVectorFormat::UnifiedVectorFormat(&local_a8.unified);
  local_a8.children.
  super_vector<duckdb::RecursiveUnifiedVectorFormat,_std::allocator<duckdb::RecursiveUnifiedVectorFormat>_>
  .
  super__Vector_base<duckdb::RecursiveUnifiedVectorFormat,_std::allocator<duckdb::RecursiveUnifiedVectorFormat>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.children.
  super_vector<duckdb::RecursiveUnifiedVectorFormat,_std::allocator<duckdb::RecursiveUnifiedVectorFormat>_>
  .
  super__Vector_base<duckdb::RecursiveUnifiedVectorFormat,_std::allocator<duckdb::RecursiveUnifiedVectorFormat>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.children.
  super_vector<duckdb::RecursiveUnifiedVectorFormat,_std::allocator<duckdb::RecursiveUnifiedVectorFormat>_>
  .
  super__Vector_base<duckdb::RecursiveUnifiedVectorFormat,_std::allocator<duckdb::RecursiveUnifiedVectorFormat>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  LogicalType::LogicalType(&local_a8.logical_type);
  Vector::RecursiveToUnifiedFormat(inputs,count,&local_a8);
  UnifiedVectorFormat::UnifiedVectorFormat(&local_f0);
  Vector::ToUnifiedFormat(state_vector,count,&local_f0);
  optional_ptr<duckdb::FunctionData,_true>::CheckValid(&aggr_input_data->bind_data);
  pFVar1 = (aggr_input_data->bind_data).ptr;
  local_f8 = 0;
  if (count != 0) {
    do {
      iVar2 = local_f8;
      if ((local_f0.sel)->sel_vector != (sel_t *)0x0) {
        iVar2 = (idx_t)(local_f0.sel)->sel_vector[local_f8];
      }
      linked_list = *(LinkedList **)(local_f0.data + iVar2 * 8);
      ArenaAllocator::AlignNext(aggr_input_data->allocator);
      ListSegmentFunctions::AppendRow
                ((ListSegmentFunctions *)(pFVar1 + 4),aggr_input_data->allocator,linked_list,
                 &local_a8,&local_f8);
      local_f8 = local_f8 + 1;
    } while (local_f8 < count);
  }
  if (local_f0.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_f0.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_f0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_f0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  LogicalType::~LogicalType(&local_a8.logical_type);
  ::std::
  vector<duckdb::RecursiveUnifiedVectorFormat,_std::allocator<duckdb::RecursiveUnifiedVectorFormat>_>
  ::~vector(&local_a8.children.
             super_vector<duckdb::RecursiveUnifiedVectorFormat,_std::allocator<duckdb::RecursiveUnifiedVectorFormat>_>
           );
  if (local_a8.unified.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_a8.unified.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_a8.unified.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_a8.unified.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
               internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

static void ListUpdateFunction(Vector inputs[], AggregateInputData &aggr_input_data, idx_t input_count,
                               Vector &state_vector, idx_t count) {

	D_ASSERT(input_count == 1);
	auto &input = inputs[0];
	RecursiveUnifiedVectorFormat input_data;
	Vector::RecursiveToUnifiedFormat(input, count, input_data);

	UnifiedVectorFormat states_data;
	state_vector.ToUnifiedFormat(count, states_data);
	auto states = UnifiedVectorFormat::GetData<ListAggState *>(states_data);

	auto &list_bind_data = aggr_input_data.bind_data->Cast<ListBindData>();

	for (idx_t i = 0; i < count; i++) {
		auto &state = *states[states_data.sel->get_index(i)];
		aggr_input_data.allocator.AlignNext();
		list_bind_data.functions.AppendRow(aggr_input_data.allocator, state.linked_list, input_data, i);
	}
}